

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O3

void ClipperLib::Minkowski(Path *poly,Path *path,Paths *solution,bool isSum,bool isClosed)

{
  long *plVar1;
  cInt cVar2;
  Paths *this;
  pointer pIVar3;
  pointer pIVar4;
  undefined7 in_register_00000009;
  pointer pIVar5;
  ulong uVar6;
  ulong uVar7;
  IntPoint *pIVar8;
  ulong uVar9;
  ulong uVar10;
  size_type __n;
  long lVar11;
  iterator iVar12;
  undefined3 in_register_00000081;
  uint uVar13;
  ulong uVar14;
  double dVar15;
  Path p;
  Paths pp;
  vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> local_b8;
  ulong local_98;
  ulong local_90;
  size_type local_88;
  size_type local_80;
  IntPoint local_78;
  undefined1 local_68 [16];
  pointer local_58;
  pointer local_50;
  pointer local_48;
  Paths *local_40;
  ulong local_38;
  
  uVar13 = CONCAT31(in_register_00000081,isClosed);
  local_98 = CONCAT44(local_98._4_4_,(int)CONCAT71(in_register_00000009,isSum));
  local_48 = (poly->super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>)
             ._M_impl.super__Vector_impl_data._M_start;
  local_50 = (poly->super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>)
             ._M_impl.super__Vector_impl_data._M_finish;
  pIVar3 = (path->super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>).
           _M_impl.super__Vector_impl_data._M_start;
  pIVar5 = (path->super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  __n = (long)pIVar5 - (long)pIVar3 >> 4;
  local_68 = (undefined1  [16])0x0;
  local_58 = (pointer)0x0;
  local_40 = solution;
  std::
  vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
  ::reserve((vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
             *)local_68,__n);
  local_90 = CONCAT44(local_90._4_4_,uVar13);
  local_80 = (long)local_50 - (long)local_48 >> 4;
  local_88 = __n;
  if ((char)local_98 == '\0') {
    if (pIVar5 != pIVar3) {
      local_98 = __n + (__n == 0);
      uVar14 = 0;
      do {
        local_b8.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_b8.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_b8.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (IntPoint *)0x0;
        std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::reserve
                  (&local_b8,local_80);
        pIVar3 = (poly->
                 super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        if ((poly->super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>).
            _M_impl.super__Vector_impl_data._M_finish != pIVar3) {
          lVar11 = 0;
          uVar10 = 0;
          do {
            pIVar5 = (path->
                     super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                     )._M_impl.super__Vector_impl_data._M_start + uVar14;
            plVar1 = (long *)((long)&pIVar3->X + lVar11);
            local_78.X = pIVar5->X - *plVar1;
            local_78.Y = pIVar5->Y - plVar1[1];
            if (local_b8.
                super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
                _M_impl.super__Vector_impl_data._M_finish ==
                local_b8.
                super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::
              _M_realloc_insert<ClipperLib::IntPoint>
                        (&local_b8,
                         (iterator)
                         local_b8.
                         super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                         ._M_impl.super__Vector_impl_data._M_finish,&local_78);
            }
            else {
              (local_b8.
               super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
               _M_impl.super__Vector_impl_data._M_finish)->X = local_78.X;
              (local_b8.
               super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
               _M_impl.super__Vector_impl_data._M_finish)->Y = local_78.Y;
              local_b8.
              super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
              _M_impl.super__Vector_impl_data._M_finish =
                   local_b8.
                   super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
                   _M_impl.super__Vector_impl_data._M_finish + 1;
            }
            uVar10 = uVar10 + 1;
            pIVar3 = (poly->
                     super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            lVar11 = lVar11 + 0x10;
          } while (uVar10 < (ulong)((long)(poly->
                                          super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                                          )._M_impl.super__Vector_impl_data._M_finish - (long)pIVar3
                                   >> 4));
        }
        std::
        vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
        ::push_back((vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                     *)local_68,&local_b8);
        __n = local_88;
        uVar13 = (uint)local_90;
        if (local_b8.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_b8.
                          super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_b8.
                                super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_b8.
                                super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        uVar14 = uVar14 + 1;
      } while (uVar14 != local_98);
    }
  }
  else if (pIVar5 != pIVar3) {
    local_98 = __n + (__n == 0);
    uVar14 = 0;
    do {
      local_b8.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_b8.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_b8.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (IntPoint *)0x0;
      std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::reserve
                (&local_b8,local_80);
      pIVar3 = (poly->
               super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>).
               _M_impl.super__Vector_impl_data._M_start;
      if ((poly->super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>).
          _M_impl.super__Vector_impl_data._M_finish != pIVar3) {
        lVar11 = 0;
        uVar10 = 0;
        do {
          pIVar5 = (path->
                   super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>).
                   _M_impl.super__Vector_impl_data._M_start + uVar14;
          plVar1 = (long *)((long)&pIVar3->X + lVar11);
          local_78.X = *plVar1 + pIVar5->X;
          local_78.Y = plVar1[1] + pIVar5->Y;
          if (local_b8.
              super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
              _M_impl.super__Vector_impl_data._M_finish ==
              local_b8.
              super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::
            _M_realloc_insert<ClipperLib::IntPoint>
                      (&local_b8,
                       (iterator)
                       local_b8.
                       super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                       ._M_impl.super__Vector_impl_data._M_finish,&local_78);
          }
          else {
            (local_b8.
             super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl
             .super__Vector_impl_data._M_finish)->X = local_78.X;
            (local_b8.
             super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl
             .super__Vector_impl_data._M_finish)->Y = local_78.Y;
            local_b8.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 local_b8.
                 super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
                 _M_impl.super__Vector_impl_data._M_finish + 1;
          }
          uVar10 = uVar10 + 1;
          pIVar3 = (poly->
                   super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          lVar11 = lVar11 + 0x10;
        } while (uVar10 < (ulong)((long)(poly->
                                        super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                                        )._M_impl.super__Vector_impl_data._M_finish - (long)pIVar3
                                 >> 4));
      }
      std::
      vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
      ::push_back((vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                   *)local_68,&local_b8);
      __n = local_88;
      uVar13 = (uint)local_90;
      if (local_b8.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_b8.
                        super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_b8.
                              super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_b8.
                              super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      uVar14 = uVar14 + 1;
    } while (uVar14 != local_98);
  }
  this = local_40;
  std::
  vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
  ::_M_erase_at_end(local_40,(local_40->
                             super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start);
  std::
  vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
  ::reserve(this,(local_80 + 1) * ((uVar13 & 0xff) + __n));
  local_38 = __n - (byte)((byte)uVar13 ^ 1);
  if (local_38 != 0) {
    local_98 = local_80 + (local_80 == 0);
    uVar14 = 0;
    do {
      local_90 = uVar14 + 1;
      if (local_50 != local_48) {
        uVar10 = 0;
        do {
          local_b8.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_b8.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_b8.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (IntPoint *)0x0;
          std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::reserve
                    (&local_b8,4);
          uVar6 = uVar14 % local_88;
          uVar7 = uVar10 % local_80;
          pIVar8 = (((pointer)(local_68._0_8_ + uVar6 * 0x18))->
                   super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>).
                   _M_impl.super__Vector_impl_data._M_start + uVar7;
          if (local_b8.
              super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
              _M_impl.super__Vector_impl_data._M_finish ==
              local_b8.
              super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<ClipperLib::IntPoint,std::allocator<ClipperLib::IntPoint>>::
            _M_realloc_insert<ClipperLib::IntPoint_const&>
                      ((vector<ClipperLib::IntPoint,std::allocator<ClipperLib::IntPoint>> *)
                       &local_b8,
                       (iterator)
                       local_b8.
                       super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                       ._M_impl.super__Vector_impl_data._M_finish,pIVar8);
            iVar12._M_current =
                 local_b8.
                 super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
          }
          else {
            cVar2 = pIVar8->Y;
            (local_b8.
             super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl
             .super__Vector_impl_data._M_finish)->X = pIVar8->X;
            (local_b8.
             super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl
             .super__Vector_impl_data._M_finish)->Y = cVar2;
            iVar12._M_current =
                 local_b8.
                 super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
                 _M_impl.super__Vector_impl_data._M_finish + 1;
            local_b8.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
            ._M_impl.super__Vector_impl_data._M_finish = iVar12._M_current;
          }
          uVar9 = local_90 % local_88;
          pIVar8 = (((pointer)(local_68._0_8_ + uVar9 * 0x18))->
                   super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>).
                   _M_impl.super__Vector_impl_data._M_start + uVar7;
          if (iVar12._M_current ==
              local_b8.
              super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<ClipperLib::IntPoint,std::allocator<ClipperLib::IntPoint>>::
            _M_realloc_insert<ClipperLib::IntPoint_const&>
                      ((vector<ClipperLib::IntPoint,std::allocator<ClipperLib::IntPoint>> *)
                       &local_b8,iVar12,pIVar8);
            iVar12._M_current =
                 local_b8.
                 super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
          }
          else {
            cVar2 = pIVar8->Y;
            (iVar12._M_current)->X = pIVar8->X;
            (iVar12._M_current)->Y = cVar2;
            iVar12._M_current =
                 local_b8.
                 super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
                 _M_impl.super__Vector_impl_data._M_finish + 1;
            local_b8.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
            ._M_impl.super__Vector_impl_data._M_finish = iVar12._M_current;
          }
          uVar10 = uVar10 + 1;
          uVar7 = uVar10 % local_80;
          pIVar8 = (((pointer)(local_68._0_8_ + uVar9 * 0x18))->
                   super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>).
                   _M_impl.super__Vector_impl_data._M_start + uVar7;
          if (iVar12._M_current ==
              local_b8.
              super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<ClipperLib::IntPoint,std::allocator<ClipperLib::IntPoint>>::
            _M_realloc_insert<ClipperLib::IntPoint_const&>
                      ((vector<ClipperLib::IntPoint,std::allocator<ClipperLib::IntPoint>> *)
                       &local_b8,iVar12,pIVar8);
            iVar12._M_current =
                 local_b8.
                 super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
          }
          else {
            cVar2 = pIVar8->Y;
            (iVar12._M_current)->X = pIVar8->X;
            (iVar12._M_current)->Y = cVar2;
            iVar12._M_current =
                 local_b8.
                 super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
                 _M_impl.super__Vector_impl_data._M_finish + 1;
            local_b8.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
            ._M_impl.super__Vector_impl_data._M_finish = iVar12._M_current;
          }
          pIVar8 = (((pointer)(local_68._0_8_ + uVar6 * 0x18))->
                   super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>).
                   _M_impl.super__Vector_impl_data._M_start + uVar7;
          if (iVar12._M_current ==
              local_b8.
              super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<ClipperLib::IntPoint,std::allocator<ClipperLib::IntPoint>>::
            _M_realloc_insert<ClipperLib::IntPoint_const&>
                      ((vector<ClipperLib::IntPoint,std::allocator<ClipperLib::IntPoint>> *)
                       &local_b8,iVar12,pIVar8);
          }
          else {
            cVar2 = pIVar8->Y;
            (iVar12._M_current)->X = pIVar8->X;
            (iVar12._M_current)->Y = cVar2;
            local_b8.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 local_b8.
                 super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
                 _M_impl.super__Vector_impl_data._M_finish + 1;
          }
          dVar15 = Area(&local_b8);
          if (dVar15 < 0.0) {
            pIVar5 = local_b8.
                     super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                     ._M_impl.super__Vector_impl_data._M_finish + -1;
            pIVar3 = local_b8.
                     super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            if (local_b8.
                super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
                _M_impl.super__Vector_impl_data._M_start < pIVar5 &&
                local_b8.
                super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
                _M_impl.super__Vector_impl_data._M_start !=
                local_b8.
                super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
                _M_impl.super__Vector_impl_data._M_finish) {
              do {
                pIVar4 = pIVar3 + 1;
                local_78.X = pIVar3->X;
                local_78.Y = pIVar3->Y;
                cVar2 = pIVar5->Y;
                pIVar3->X = pIVar5->X;
                pIVar3->Y = cVar2;
                pIVar5->X = local_78.X;
                pIVar5->Y = local_78.Y;
                pIVar5 = pIVar5 + -1;
                pIVar3 = pIVar4;
              } while (pIVar4 < pIVar5);
            }
          }
          std::
          vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
          ::push_back(local_40,&local_b8);
          if (local_b8.
              super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_b8.
                            super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_b8.
                                  super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_b8.
                                  super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
        } while (uVar10 != local_98);
      }
      uVar14 = local_90;
    } while (local_90 != local_38);
  }
  std::
  vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
  ::~vector((vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
             *)local_68);
  return;
}

Assistant:

void Minkowski(const Path& poly, const Path& path, 
  Paths& solution, bool isSum, bool isClosed)
{
  int delta = (isClosed ? 1 : 0);
  size_t polyCnt = poly.size();
  size_t pathCnt = path.size();
  Paths pp;
  pp.reserve(pathCnt);
  if (isSum)
    for (size_t i = 0; i < pathCnt; ++i)
    {
      Path p;
      p.reserve(polyCnt);
      for (size_t j = 0; j < poly.size(); ++j)
        p.push_back(IntPoint(path[i].X + poly[j].X, path[i].Y + poly[j].Y));
      pp.push_back(p);
    }
  else
    for (size_t i = 0; i < pathCnt; ++i)
    {
      Path p;
      p.reserve(polyCnt);
      for (size_t j = 0; j < poly.size(); ++j)
        p.push_back(IntPoint(path[i].X - poly[j].X, path[i].Y - poly[j].Y));
      pp.push_back(p);
    }

  solution.clear();
  solution.reserve((pathCnt + delta) * (polyCnt + 1));
  for (size_t i = 0; i < pathCnt - 1 + delta; ++i)
    for (size_t j = 0; j < polyCnt; ++j)
    {
      Path quad;
      quad.reserve(4);
      quad.push_back(pp[i % pathCnt][j % polyCnt]);
      quad.push_back(pp[(i + 1) % pathCnt][j % polyCnt]);
      quad.push_back(pp[(i + 1) % pathCnt][(j + 1) % polyCnt]);
      quad.push_back(pp[i % pathCnt][(j + 1) % polyCnt]);
      if (!Orientation(quad)) ReversePath(quad);
      solution.push_back(quad);
    }
}